

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

qsizetype QtPrivate::indexOf<QTableWidgetItem*,QTableWidgetItem*>
                    (QList<QTableWidgetItem_*> *vector,QTableWidgetItem **u,qsizetype from)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  qsizetype qVar6;
  
  uVar2 = (vector->d).size;
  uVar4 = from;
  if (from < 0) {
    uVar4 = from + uVar2;
    if ((long)(from + uVar2) < 1) {
      uVar4 = 0;
    }
  }
  qVar6 = -1;
  if (uVar4 < uVar2) {
    lVar5 = uVar4 * 8 + -8;
    do {
      if (uVar2 * -8 + lVar5 == -8) {
        return -1;
      }
      lVar1 = lVar5 + 8;
      lVar3 = lVar5 + 8;
      lVar5 = lVar1;
    } while (*(QTableWidgetItem **)((long)(vector->d).ptr + lVar3) != *u);
    qVar6 = lVar1 >> 3;
  }
  return qVar6;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }